

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O2

list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
DisconnectedBlockTransactions::take_abi_cxx11_
          (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,DisconnectedBlockTransactions *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)__return_storage_ptr__,(_List_node_header *)&this->queuedTx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    clear(this);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::list<CTransactionRef> DisconnectedBlockTransactions::take()
{
    std::list<CTransactionRef> ret = std::move(queuedTx);
    clear();
    return ret;
}